

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O2

void lace_suspend(void)

{
  do {
  } while (lace_awaken_count < 1);
  if (lace_awaken_count != 1) {
    LOCK();
    lace_awaken_count = lace_awaken_count + -1;
    UNLOCK();
    return;
  }
  LOCK();
  UNLOCK();
  do {
  } while (workers_running != n_workers);
  do {
  } while (workers_running != 0);
  must_suspend = 0;
  lace_awaken_count = 0;
  return;
}

Assistant:

void
lace_suspend()
{
    while (1) {
        int state = atomic_load_explicit(&lace_awaken_count, memory_order_consume);
        // state "should" be >= 1 !!
        if (state <= 0) {
            continue; // ???
        } else if (state == 1) {
            int next = -1; // intermediate state
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) {
                while (workers_running != n_workers) {} // they must first run, to avoid rare condition
                atomic_thread_fence(memory_order_seq_cst);
                atomic_store_explicit(&must_suspend, 1, memory_order_relaxed);
                while (workers_running != 0) {}
                atomic_thread_fence(memory_order_seq_cst);
                atomic_store_explicit(&must_suspend, 0, memory_order_relaxed);
                atomic_store_explicit(&lace_awaken_count, 0, memory_order_release);
                break;
            }
        } else {
            int next = state - 1;
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) break;
        }
    }
}